

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void parse_affix_argument(vw *all,string *str)

{
  char cVar1;
  char *__dest;
  char *__s;
  ulong uVar2;
  size_t sVar3;
  vw_exception *pvVar4;
  char *pcVar5;
  ulong uVar6;
  stringstream __msg;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  if (str->_M_string_length == 0) {
    return;
  }
  __dest = calloc_or_throw<char>(str->_M_string_length + 1);
  strcpy(__dest,(str->_M_dataplus)._M_p);
  __s = strtok(__dest,",");
  while( true ) {
    if (__s == (char *)0x0) {
      free(__dest);
      return;
    }
    if (*__s == '-') {
      uVar2 = 0;
      pcVar5 = __s + 1;
    }
    else {
      uVar2 = 1;
      pcVar5 = __s;
      if (*__s == '+') {
        pcVar5 = __s + 1;
      }
    }
    if ((byte)(*pcVar5 - 0x38U) < 0xf9) break;
    cVar1 = pcVar5[1];
    uVar6 = 0x20;
    if (cVar1 != '\0') {
      if ((cVar1 == ':') || (cVar1 == '|')) {
        std::__cxx11::stringstream::stringstream(local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a0,"malformed affix argument (invalid namespace): ",0x2e);
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,__s,sVar3);
        pvVar4 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                   ,0x143,&local_1f0);
        __cxa_throw(pvVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (pcVar5[2] != '\0') {
        std::__cxx11::stringstream::stringstream(local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a0,"malformed affix argument (too long): ",0x25);
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,__s,sVar3);
        pvVar4 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                   ,0x146,&local_210);
        __cxa_throw(pvVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      uVar6 = (ulong)cVar1;
    }
    all->affix_features[uVar6 & 0xffff] =
         all->affix_features[uVar6 & 0xffff] << 4 | uVar2 | (byte)(*pcVar5 * '\x02' + 0xa0);
    __s = strtok((char *)0x0,",");
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1a0,"malformed affix argument (length must be 1..7): ",0x30);
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,__s,sVar3);
  pvVar4 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x13a,&local_1d0);
  __cxa_throw(pvVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_affix_argument(vw& all, string str)
{
  if (str.length() == 0)
    return;
  char* cstr = calloc_or_throw<char>(str.length() + 1);
  strcpy(cstr, str.c_str());

  char* p = strtok(cstr, ",");

  try
  {
    while (p != 0)
    {
      char* q = p;
      uint16_t prefix = 1;
      if (q[0] == '+')
      {
        q++;
      }
      else if (q[0] == '-')
      {
        prefix = 0;
        q++;
      }
      if ((q[0] < '1') || (q[0] > '7'))
        THROW("malformed affix argument (length must be 1..7): " << p);

      uint16_t len = (uint16_t)(q[0] - '0');
      uint16_t ns = (uint16_t)' ';  // default namespace
      if (q[1] != 0)
      {
        if (valid_ns(q[1]))
          ns = (uint16_t)q[1];
        else
          THROW("malformed affix argument (invalid namespace): " << p);

        if (q[2] != 0)
          THROW("malformed affix argument (too long): " << p);
      }

      uint16_t afx = (len << 1) | (prefix & 0x1);
      all.affix_features[ns] <<= 4;
      all.affix_features[ns] |= afx;

      p = strtok(nullptr, ",");
    }
  }
  catch (...)
  {
    free(cstr);
    throw;
  }

  free(cstr);
}